

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.h
# Opt level: O2

void __thiscall re2::ExhaustiveTester::~ExhaustiveTester(ExhaustiveTester *this)

{
  ~ExhaustiveTester(this);
  operator_delete(this);
  return;
}

Assistant:

ExhaustiveTester(int maxatoms,
                   int maxops,
                   const vector<string>& alphabet,
                   const vector<string>& ops,
                   int maxstrlen,
                   const vector<string>& stralphabet,
                   const string& wrapper,
                   const string& topwrapper)
    : RegexpGenerator(maxatoms, maxops, alphabet, ops),
      strgen_(maxstrlen, stralphabet),
      wrapper_(wrapper),
      topwrapper_(topwrapper),
      regexps_(0), tests_(0), failures_(0),
      randomstrings_(0), stringseed_(0), stringcount_(0)  { }